

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
::~DeviceObjectBase(DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                    *this)

{
  IMemoryAllocator *pIVar1;
  
  (this->super_ObjectBase<Diligent::IBufferVk>).super_RefCountedObject<Diligent::IBufferVk>.
  super_IBufferVk.super_IBuffer.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00a53480;
  pIVar1 = GetStringAllocator();
  (*pIVar1->_vptr_IMemoryAllocator[1])(pIVar1,(this->m_Desc).super_DeviceObjectAttribs.Name);
  if (this->m_bIsDeviceInternal == false) {
    RefCountedObject<Diligent::IRenderDeviceVk>::Release
              ((RefCountedObject<Diligent::IRenderDeviceVk> *)this->m_pDevice);
  }
  RefCntAutoPtr<Diligent::IObject>::Release(&this->m_pUserData);
  return;
}

Assistant:

virtual ~DeviceObjectBase()
    {
        FREE(GetStringAllocator(), const_cast<Char*>(m_Desc.Name));

        if (!m_bIsDeviceInternal)
        {
            m_pDevice->Release();
        }
    }